

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O2

void __thiscall cursespp::SimpleScrollAdapter::AddEntry(SimpleScrollAdapter *this,string *value)

{
  SingleLineEntry *this_00;
  __shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  EntryPtr entry;
  
  this_00 = (SingleLineEntry *)operator_new(0x38);
  SingleLineEntry::SingleLineEntry(this_00,value);
  std::__shared_ptr<cursespp::IScrollAdapter::IEntry,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::SingleLineEntry,void>
            ((__shared_ptr<cursespp::IScrollAdapter::IEntry,(__gnu_cxx::_Lock_policy)2> *)
             &entry.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
             ,this_00);
  std::__shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &entry.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
            );
  (*(this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter[9])(this,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&entry.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void SimpleScrollAdapter::AddEntry(const std::string& value) {
    EntryPtr entry(new SingleLineEntry(value));
    this->AddEntry(entry);
}